

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

int mpz_cmp_d(__mpz_struct *x,double d)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  if (x->_mp_size < 0) {
    if (0.0 <= d) {
      return -1;
    }
    iVar3 = mpz_cmpabs_d(x,d);
    return -iVar3;
  }
  if (d < 0.0) {
    return 1;
  }
  uVar1 = x->_mp_size;
  uVar5 = -(ulong)(-d <= d);
  dVar6 = (double)(~uVar5 & (ulong)-d | (ulong)d & uVar5);
  if (uVar1 != 0) {
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar4 = (ulong)uVar2;
    uVar5 = uVar4;
    while (uVar5 = uVar5 - 1, uVar5 != 0) {
      dVar6 = dVar6 * 5.421010862427522e-20;
    }
    if (1.8446744073709552e+19 <= dVar6) {
      return -1;
    }
    for (; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
      uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
      if (uVar5 < x->_mp_d[uVar4 - 1]) {
        return 1;
      }
      if (x->_mp_d[uVar4 - 1] < uVar5) {
        return -1;
      }
      auVar7._8_4_ = (int)(uVar5 >> 0x20);
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = 0x45300000;
      dVar6 = (dVar6 - ((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0))) *
              1.8446744073709552e+19;
    }
  }
  return -(uint)(0.0 < dVar6);
}

Assistant:

int
mpz_cmp_d (const mpz_t x, double d)
{
  if (x->_mp_size < 0)
    {
      if (d >= 0.0)
	return -1;
      else
	return -mpz_cmpabs_d (x, d);
    }
  else
    {
      if (d < 0.0)
	return 1;
      else
	return mpz_cmpabs_d (x, d);
    }
}